

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::EquivScannerMixinT<4U>::Match
          (EquivScannerMixinT<4U> *this,Matcher *matcher,char16 *input,CharCount inputLength,
          CharCount *inputOffset)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  Program *pPVar4;
  undefined4 *puVar5;
  char16_t **ppcVar6;
  CharCount *inputOffset_local;
  CharCount inputLength_local;
  char16 *input_local;
  Matcher *matcher_local;
  EquivScannerMixinT<4U> *this_local;
  
  TVar1 = (this->super_ScannerMixin).super_LiteralMixin.length;
  pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&matcher->program);
  if ((pPVar4->rep).insts.litbufLen - (this->super_ScannerMixin).super_LiteralMixin.offset <
      TVar1 << 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x2ae,
                       "(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset)"
                       ,
                       "length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&matcher->program);
  ppcVar6 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                      ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
  bVar3 = TextbookBoyerMoore<char16_t>::Match<4u,4u>
                    (&(this->super_ScannerMixin).scanner,input,inputLength,inputOffset,
                     *ppcVar6 + (this->super_ScannerMixin).super_LiteralMixin.offset,
                     (this->super_ScannerMixin).super_LiteralMixin.length,matcher->stats);
  return bVar3;
}

Assistant:

inline bool EquivScannerMixinT<lastPatCharEquivClassSize>::Match(Matcher& matcher, const char16* const input, const CharCount inputLength, CharCount& inputOffset) const
    {
        Assert(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset);
        CompileAssert(lastPatCharEquivClassSize >= 1 && lastPatCharEquivClassSize <= CaseInsensitive::EquivClassSize);
        return scanner.Match<CaseInsensitive::EquivClassSize, lastPatCharEquivClassSize>(
            input
            , inputLength
            , inputOffset
            , matcher.program->rep.insts.litbuf + offset
            , length
#if ENABLE_REGEX_CONFIG_OPTIONS
            , matcher.stats
#endif
            );
    }